

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O2

TestCaseResultPtr __thiscall xe::BatchResult::getTestCaseResult(BatchResult *this,char *casePath)

{
  char *in_RDX;
  TestCaseResultPtr TVar1;
  allocator<char> local_39;
  key_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,in_RDX,&local_39);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)(casePath + 0xf8),&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  TVar1 = getTestCaseResult(this,(int)casePath);
  TVar1.m_ptr = (TestCaseResultData *)this;
  return TVar1;
}

Assistant:

TestCaseResultPtr BatchResult::getTestCaseResult (const char* casePath)
{
	map<string, int>::const_iterator pos = m_resultMap.find(casePath);
	DE_ASSERT(pos != m_resultMap.end());
	return getTestCaseResult(pos->second);
}